

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  int iVar1;
  int iVar2;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExprList *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  MOJOSHADER_astDataTypeType MVar6;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar3 = reduce_datatype(ctx,dt);
  MVar6 = pMVar3->type;
  if (MVar6 - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    MVar6 = ((pMVar3->array).base)->type;
  }
  iVar2 = datatype_elems(ctx,dt);
  iVar1 = ast->identifier->index;
  pMVar4 = build_ir_exprlist(ctx,ast->args);
  pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x30,ctx->malloc_data);
  if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar5->ir).type = MOJOSHADER_IR_CALL;
    (pMVar5->ir).filename = ctx->sourcefile;
    (pMVar5->ir).line = ctx->sourceline;
    (pMVar5->info).type = MVar6;
    (pMVar5->info).elements = iVar2;
    (pMVar5->call).args = pMVar4;
    (pMVar5->temp).index = iVar1;
  }
  return pMVar5;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_call(Context *ctx, const MOJOSHADER_astExpressionCallFunction *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_call(ctx, ast->identifier->index, build_ir_exprlist(ctx, ast->args), type, elems);
}